

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O3

bool __thiscall embree::TokenStream::tryString(TokenStream *this,Token *token,ParseLocation *loc)

{
  int iVar1;
  Stream<int> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  uint uVar4;
  int *piVar5;
  runtime_error *this_02;
  long *plVar6;
  size_type *psVar7;
  string str;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  string local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 local_b8 [8];
  _Alloc_hider local_b0;
  char local_a0 [16];
  element_type *local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_88;
  ssize_t local_80;
  ssize_t sStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_138 = local_128;
  local_130 = 0;
  local_128[0] = 0;
  piVar5 = Stream<int>::peek((this->cin).ptr);
  iVar1 = *piVar5;
  if (iVar1 == 0x22) {
    Stream<int>::drop((this->cin).ptr);
    while( true ) {
      piVar5 = Stream<int>::peek((this->cin).ptr);
      this_00 = (this->cin).ptr;
      if (*piVar5 == 0x22) break;
      uVar4 = Stream<int>::get(this_00);
      if ((0xff < uVar4) || (this->isStringCharMap[uVar4] == false)) {
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_d8,'\x01');
        std::operator+(&local_50,"invalid string character ",&local_d8);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_118._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_118._M_dataplus._M_p == psVar7) {
          local_118.field_2._M_allocated_capacity = *psVar7;
          local_118.field_2._8_8_ = plVar6[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = *psVar7;
        }
        local_118._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        ParseLocation::str_abi_cxx11_(&local_70,loc);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                       ,&local_118,&local_70);
        std::runtime_error::runtime_error(this_02,(string *)local_b8);
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::push_back((char)&local_138);
    }
    Stream<int>::drop(this_00);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_f8,local_138,local_138 + local_130);
    Token::Token((Token *)local_b8,&local_f8,TY_STRING,loc);
    token->ty = local_b8._0_4_;
    token->field_1 = (anon_union_4_3_4e90a026_for_Token_2)local_b8._4_4_;
    std::__cxx11::string::operator=((string *)&token->str,(string *)&local_b0);
    _Var3._M_pi = _Stack_88._M_pi;
    peVar2 = local_90;
    local_90 = (element_type *)0x0;
    _Stack_88._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    this_01 = (token->loc).fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar2;
    (token->loc).fileName.
    super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = _Var3._M_pi;
    if (this_01 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (token->loc).lineNumber = local_80;
      (token->loc).colNumber = sStack_78;
    }
    else {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      (token->loc).lineNumber = local_80;
      (token->loc).colNumber = sStack_78;
      if (_Stack_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_88._M_pi);
      }
    }
    if (local_b0._M_p != local_a0) {
      operator_delete(local_b0._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
  }
  if (local_138 != local_128) {
    operator_delete(local_138);
  }
  return iVar1 == 0x22;
}

Assistant:

bool TokenStream::tryString(Token& token, const ParseLocation& loc)
  {
    std::string str;
    if (cin->peek() != '\"') return false;
    cin->drop();
    while (cin->peek() != '\"') {
      const int c = cin->get();
      if (!isStringChar(c)) THROW_RUNTIME_ERROR("invalid string character "+std::string(1,c)+" at "+loc.str());
      str += (char)c;
    }
    cin->drop();
    token = Token(str,Token::TY_STRING,loc);
    return true;
  }